

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_parser.c
# Opt level: O0

void av1d_frame_unref(Av1CodecContext *ctx,AV1Frame *f)

{
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  MppBuffer local_28;
  MppBuffer framebuf;
  AV1Context *s;
  AV1Frame *f_local;
  Av1CodecContext *ctx_local;
  
  framebuf = ctx->priv_data;
  f->raw_frame_header = (AV1RawFrameHeader *)0x0;
  f->temporal_id = 0;
  f->spatial_id = 0;
  s = (AV1Context *)f;
  f_local = (AV1Frame *)ctx;
  memset(f->skip_mode_frame_idx,0,2);
  memset((void *)((long)s->ref[0].gm_params[5].wmmat_val + 10),0,0xa6);
  s->ref[0].skip_mode_frame_idx[0] = '\0';
  lVar1._0_2_ = s->ref[0].film_grain.grain_seed;
  lVar1._2_1_ = s->ref[0].film_grain.update_grain;
  lVar1._3_1_ = s->ref[0].film_grain.film_grain_params_ref_idx;
  lVar1._4_1_ = s->ref[0].film_grain.num_y_points;
  lVar1._5_1_ = s->ref[0].film_grain.point_y_value[0];
  lVar1._6_1_ = s->ref[0].film_grain.point_y_value[1];
  lVar1._7_1_ = s->ref[0].film_grain.point_y_value[2];
  if (((lVar1 == 0) || (**(int **)&s->ref[0].film_grain.grain_seed < 1)) ||
     (0x7e < (int)(s->gb).bytes_left_)) {
    _mpp_log_l(2,"av1d_parser","ref count alreay is zero",(char *)0x0);
  }
  else {
    piVar2 = *(int **)&s->ref[0].film_grain.grain_seed;
    *piVar2 = *piVar2 + -1;
    if ((av1d_debug & 4) != 0) {
      uVar3._0_2_ = s->ref[0].film_grain.grain_seed;
      uVar3._2_1_ = s->ref[0].film_grain.update_grain;
      uVar3._3_1_ = s->ref[0].film_grain.film_grain_params_ref_idx;
      uVar3._4_1_ = s->ref[0].film_grain.num_y_points;
      uVar3._5_1_ = s->ref[0].film_grain.point_y_value[0];
      uVar3._6_1_ = s->ref[0].film_grain.point_y_value[1];
      uVar3._7_1_ = s->ref[0].film_grain.point_y_value[2];
      _mpp_log_l(4,"av1d_parser","ref %p, f->ref->ref_count %d, ref->invisible= %d",
                 "av1d_frame_unref",uVar3,(ulong)**(uint **)&s->ref[0].film_grain.grain_seed,
                 *(undefined4 *)(*(long *)&s->ref[0].film_grain.grain_seed + 4));
    }
    if (**(int **)&s->ref[0].film_grain.grain_seed == 0) {
      if ((int)(s->gb).bytes_left_ < 0x7f) {
        if ((av1d_debug & 4) != 0) {
          _mpp_log_l(4,"av1d_parser","clr f->slot_index = %d","av1d_frame_unref",
                     (ulong)(s->gb).bytes_left_);
        }
        if (*(int *)(*(long *)&s->ref[0].film_grain.grain_seed + 8) == 0) {
          local_28 = (MppBuffer)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)((long)framebuf + 0x1dba8),(s->gb).bytes_left_,SLOT_BUFFER,
                     &local_28);
          if ((av1d_debug & 4) != 0) {
            _mpp_log_l(4,"av1d_parser","free framebuf prt %p","av1d_frame_unref",local_28);
          }
          if (local_28 != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(local_28,"av1d_frame_unref");
          }
          *(undefined4 *)(*(long *)&s->ref[0].film_grain.grain_seed + 4) = 0;
        }
        mpp_buf_slot_clr_flag
                  (*(MppBufSlots *)((long)framebuf + 0x1dba8),(s->gb).bytes_left_,SLOT_CODEC_USE);
      }
      (s->gb).bytes_left_ = 0xff;
      mpp_osal_free("av1d_frame_unref",*(void **)&s->ref[0].film_grain.grain_seed);
      s->ref[0].film_grain.grain_seed = 0;
      s->ref[0].film_grain.update_grain = '\0';
      s->ref[0].film_grain.film_grain_params_ref_idx = '\0';
      s->ref[0].film_grain.num_y_points = '\0';
      s->ref[0].film_grain.point_y_value[0] = '\0';
      s->ref[0].film_grain.point_y_value[1] = '\0';
      s->ref[0].film_grain.point_y_value[2] = '\0';
    }
    s->ref[0].film_grain.grain_seed = 0;
    s->ref[0].film_grain.update_grain = '\0';
    s->ref[0].film_grain.film_grain_params_ref_idx = '\0';
    s->ref[0].film_grain.num_y_points = '\0';
    s->ref[0].film_grain.point_y_value[0] = '\0';
    s->ref[0].film_grain.point_y_value[1] = '\0';
    s->ref[0].film_grain.point_y_value[2] = '\0';
  }
  return;
}

Assistant:

static void av1d_frame_unref(Av1CodecContext *ctx, AV1Frame *f)
{
    AV1Context *s = ctx->priv_data;
    f->raw_frame_header = NULL;
    f->spatial_id = f->temporal_id = 0;
    memset(f->skip_mode_frame_idx, 0,
           2 * sizeof(uint8_t));
    memset(&f->film_grain, 0, sizeof(f->film_grain));

    f->coded_lossless = 0;

    if (!f->ref || f->ref->ref_count <= 0 || f->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        return;
    }

    f->ref->ref_count--;
    av1d_dbg(AV1D_DBG_REF, "ref %p, f->ref->ref_count %d, ref->invisible= %d", f->ref, f->ref->ref_count, f->ref->invisible);
    if (!f->ref->ref_count) {
        if (f->slot_index < 0x7f) {
            av1d_dbg(AV1D_DBG_REF, "clr f->slot_index = %d",  f->slot_index);
            /* if pic no output for disaplay when ref_cnt
               clear we will free this buffer directly,
               maybe cause some frame can't display    */
            // if (f->ref->invisible && !f->ref->is_output) {
            if (!f->ref->is_output) {
                MppBuffer framebuf = NULL;
                mpp_buf_slot_get_prop(s->slots, f->slot_index, SLOT_BUFFER, &framebuf);
                av1d_dbg(AV1D_DBG_REF, "free framebuf prt %p", framebuf);
                if (framebuf)
                    mpp_buffer_put(framebuf);
                f->ref->invisible = 0;
            }
            mpp_buf_slot_clr_flag(s->slots, f->slot_index, SLOT_CODEC_USE);
        }
        f->slot_index = 0xff;
        mpp_free(f->ref);
        f->ref = NULL;
    }
    f->ref = NULL;
}